

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_google_units.cpp
# Opt level: O0

void __thiscall
googleUnits_unitTypes_Test::googleUnits_unitTypes_Test(googleUnits_unitTypes_Test *this)

{
  googleUnits_unitTypes_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__googleUnits_unitTypes_Test_00208690;
  return;
}

Assistant:

TEST(googleUnits, unitTypes)
{
    std::ifstream tfile(TEST_FILE_FOLDER "/google_defined_units.txt");
    if (tfile.is_open()) {  // checking whether the file is open
        std::string tp;
        while (std::getline(tfile, tp)) {  // read data from file object and put
                                           // it into string.
            auto cloc = tp.find_first_of(':');
            std::string utype = tp.substr(0, cloc);
            if (utype == "Misc") {
                continue;
            }
            auto bunit = units::default_unit(utype);
            EXPECT_TRUE(is_valid(bunit))
                << utype << " does not produce a valid default unit";
        }
    }
}